

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMappedVector.hpp
# Opt level: O3

BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
* __thiscall
gmlc::containers::
StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
::find(BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
       *__return_storage_ptr__,
      StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
      *this,string_view searchValue)

{
  long lVar1;
  uint uVar2;
  iterator iVar3;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar4;
  int iVar5;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar6;
  key_type local_20;
  
  local_20._M_str = searchValue._M_str;
  local_20._M_len = searchValue._M_len;
  iVar3 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->lookup)._M_h,&local_20);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar5 = (this->dataStorage).bsize;
    ppuVar4 = (this->dataStorage).dataptr;
    if ((long)iVar5 == 0x20) {
      if (ppuVar4 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
        ppuVar4 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                  &StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                   ::end()::emptyValue;
      }
      else {
        ppuVar4 = ppuVar4 + (long)(this->dataStorage).dataSlotIndex + 1;
      }
      puVar6 = *ppuVar4;
      iVar5 = 0;
    }
    else {
      ppuVar4 = ppuVar4 + (this->dataStorage).dataSlotIndex;
      puVar6 = *ppuVar4 + iVar5;
    }
    __return_storage_ptr__->vec = ppuVar4;
    __return_storage_ptr__->ptr = puVar6;
    __return_storage_ptr__->offset = iVar5;
    return __return_storage_ptr__;
  }
  if ((this->dataStorage).csize == 0) {
    iVar5 = (this->dataStorage).bsize;
    ppuVar4 = (this->dataStorage).dataptr;
    if ((long)iVar5 != 0x20) {
      ppuVar4 = ppuVar4 + (this->dataStorage).dataSlotIndex;
      puVar6 = *ppuVar4 + iVar5;
      goto LAB_00270a14;
    }
    if (ppuVar4 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      ppuVar4 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                &StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                 ::end()::emptyValue;
    }
    else {
      ppuVar4 = ppuVar4 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppuVar4 = (this->dataStorage).dataptr;
  }
  puVar6 = *ppuVar4;
  iVar5 = 0;
LAB_00270a14:
  lVar1 = *(long *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x18);
  __return_storage_ptr__->vec = ppuVar4;
  __return_storage_ptr__->ptr = puVar6 + lVar1;
  uVar2 = (int)lVar1 + iVar5;
  __return_storage_ptr__->offset = uVar2;
  if (0x1f < (int)uVar2) {
    __return_storage_ptr__->vec = ppuVar4 + (ulong)(uVar2 - 0x20 >> 5) + 1;
    __return_storage_ptr__->offset = uVar2 & 0x1f;
    __return_storage_ptr__->ptr =
         (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
         ((long)&(ppuVar4[(ulong)(uVar2 - 0x20 >> 5) + 1]->_M_t).
                 super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                 super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl +
         (ulong)((uVar2 & 0x1f) << 3));
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(std::string_view searchValue)
        {
            auto fnd = lookup.find(searchValue);
            if (fnd != lookup.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }